

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O3

void __thiscall
CMerkleBlock::CMerkleBlock
          (CMerkleBlock *this,CBlock *block,CBloomFilter *filter,
          set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *txids)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint32_t uVar1;
  element_type *peVar2;
  pointer puVar3;
  pointer puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  base_blob<256U> *pbVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  pointer psVar12;
  const_iterator cVar13;
  ulong uVar14;
  Txid *__k;
  long in_FS_OFFSET;
  bool bVar15;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  vector<uint256,_std::allocator<uint256>_> local_d8;
  CPartialMerkleTree local_b8;
  vector<bool,_std::allocator<bool>_> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  (this->header).nBits = 0;
  (this->header).nNonce = 0;
  pbVar9 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0xc] = '\0';
  (pbVar9->m_data)._M_elems[0xd] = '\0';
  (pbVar9->m_data)._M_elems[0xe] = '\0';
  (pbVar9->m_data)._M_elems[0xf] = '\0';
  (pbVar9->m_data)._M_elems[0x10] = '\0';
  (pbVar9->m_data)._M_elems[0x11] = '\0';
  (pbVar9->m_data)._M_elems[0x12] = '\0';
  (pbVar9->m_data)._M_elems[0x13] = '\0';
  pbVar9 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x14] = '\0';
  (pbVar9->m_data)._M_elems[0x15] = '\0';
  (pbVar9->m_data)._M_elems[0x16] = '\0';
  (pbVar9->m_data)._M_elems[0x17] = '\0';
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  pbVar9 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[4] = '\0';
  (pbVar9->m_data)._M_elems[5] = '\0';
  (pbVar9->m_data)._M_elems[6] = '\0';
  (pbVar9->m_data)._M_elems[7] = '\0';
  (pbVar9->m_data)._M_elems[8] = '\0';
  (pbVar9->m_data)._M_elems[9] = '\0';
  (pbVar9->m_data)._M_elems[10] = '\0';
  (pbVar9->m_data)._M_elems[0xb] = '\0';
  pbVar9 = &(this->header).hashPrevBlock.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0xc] = '\0';
  (pbVar9->m_data)._M_elems[0xd] = '\0';
  (pbVar9->m_data)._M_elems[0xe] = '\0';
  (pbVar9->m_data)._M_elems[0xf] = '\0';
  (pbVar9->m_data)._M_elems[0x10] = '\0';
  (pbVar9->m_data)._M_elems[0x11] = '\0';
  (pbVar9->m_data)._M_elems[0x12] = '\0';
  (pbVar9->m_data)._M_elems[0x13] = '\0';
  pbVar9 = &(this->header).hashPrevBlock.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x14] = '\0';
  (pbVar9->m_data)._M_elems[0x15] = '\0';
  (pbVar9->m_data)._M_elems[0x16] = '\0';
  (pbVar9->m_data)._M_elems[0x17] = '\0';
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  (this->header).nVersion = 0;
  (this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar9 = &(this->header).hashPrevBlock.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[4] = '\0';
  (pbVar9->m_data)._M_elems[5] = '\0';
  (pbVar9->m_data)._M_elems[6] = '\0';
  (pbVar9->m_data)._M_elems[7] = '\0';
  (pbVar9->m_data)._M_elems[8] = '\0';
  (pbVar9->m_data)._M_elems[9] = '\0';
  (pbVar9->m_data)._M_elems[10] = '\0';
  (pbVar9->m_data)._M_elems[0xb] = '\0';
  CPartialMerkleTree::CPartialMerkleTree(&this->txn);
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ =
       *(undefined8 *)
        ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       *(_Bit_type **)
        ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_b8._0_8_ =
       *(undefined8 *)
        (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       *(_Bit_type **)
        ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)
           (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems;
  uVar14 = *(ulong *)((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
                      _M_elems + 8);
  uVar6 = *(undefined8 *)
           ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10)
  ;
  uVar7 = *(ulong *)((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
                     _M_elems + 0x18);
  uVar1 = (block->super_CBlockHeader).nNonce;
  uVar10 = (block->super_CBlockHeader).nTime;
  uVar11 = (block->super_CBlockHeader).nBits;
  (this->header).nVersion = (block->super_CBlockHeader).nVersion;
  *(undefined8 *)(this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems = local_b8._0_8_
  ;
  *(_Bit_type **)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  *(undefined8 *)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_;
  *(_Bit_type **)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(undefined8 *)(this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems = uVar5;
  *(ulong *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) = uVar14;
  *(undefined8 *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       uVar6;
  *(ulong *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
  (this->header).nTime = uVar10;
  (this->header).nBits = uVar11;
  (this->header).nNonce = uVar1;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = uVar14 & 0xffffffff00000000;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = uVar7 & 0xffffffff00000000;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (uint256 *)0x0;
  local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (uint256 *)0x0;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (&local_68,
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<uint256,_std::allocator<uint256>_>::reserve
            (&local_d8,
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  psVar12 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar12) {
    uVar14 = 0;
    do {
      peVar2 = psVar12[uVar14].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      __k = &peVar2->hash;
      if (txids == (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    *)0x0) {
        if (filter != (CBloomFilter *)0x0) goto LAB_00694a75;
LAB_00694ab6:
        bVar15 = false;
LAB_00694ab8:
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_68,bVar15);
      }
      else {
        cVar13 = std::
                 _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                 ::find(&txids->_M_t,__k);
        bVar15 = (_Rb_tree_header *)cVar13._M_node != &(txids->_M_t)._M_impl.super__Rb_tree_header;
        if (filter == (CBloomFilter *)0x0 || bVar15) goto LAB_00694ab8;
LAB_00694a75:
        bVar15 = CBloomFilter::IsRelevantAndUpdate
                           (filter,(block->vtx).
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [local_b8._0_8_ & 0xffffffff].
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (!bVar15) goto LAB_00694ab6;
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_68,true);
        std::vector<std::pair<unsigned_int,uint256>,std::allocator<std::pair<unsigned_int,uint256>>>
        ::emplace_back<unsigned_int&,transaction_identifier<false>const&>
                  ((vector<std::pair<unsigned_int,uint256>,std::allocator<std::pair<unsigned_int,uint256>>>
                    *)&this->vMatchedTxn,&local_b8.nTransactions,__k);
      }
      if (local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  ((vector<uint256,std::allocator<uint256>> *)&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish,&__k->m_wrapped);
      }
      else {
        uVar5 = *(undefined8 *)(__k->m_wrapped).super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar8 = *(undefined8 *)
                 ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)
         (((local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)
         (((local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar8;
        *(undefined8 *)
         ((local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar5;
        *(undefined8 *)
         (((local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) = uVar6;
        local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar14 = (ulong)(local_b8.nTransactions + 1);
      local_b8.nTransactions = local_b8.nTransactions + 1;
      psVar12 = (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(block->vtx).
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4)
            );
  }
  CPartialMerkleTree::CPartialMerkleTree(&local_b8,&local_d8,&local_68);
  (this->txn).nTransactions = local_b8.nTransactions;
  this_00 = &(this->txn).vBits;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_00->super__Bvector_base<std::allocator<bool>_>);
  (this->txn).vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->txn).vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)((long)&(this->txn).vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) =
       CONCAT44(local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  *(undefined8 *)
   ((long)&(this->txn).vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ =
       local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  puVar3 = (this->txn).vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->txn).vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->txn).vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->txn).vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->txn).vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (puVar3 == (pointer)0x0) {
    (this->txn).fBad = local_b8.fBad;
  }
  else {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    (this->txn).fBad = local_b8.fBad;
    if (local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_b8.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CMerkleBlock::CMerkleBlock(const CBlock& block, CBloomFilter* filter, const std::set<Txid>* txids)
{
    header = block.GetBlockHeader();

    std::vector<bool> vMatch;
    std::vector<uint256> vHashes;

    vMatch.reserve(block.vtx.size());
    vHashes.reserve(block.vtx.size());

    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const Txid& hash{block.vtx[i]->GetHash()};
        if (txids && txids->count(hash)) {
            vMatch.push_back(true);
        } else if (filter && filter->IsRelevantAndUpdate(*block.vtx[i])) {
            vMatch.push_back(true);
            vMatchedTxn.emplace_back(i, hash);
        } else {
            vMatch.push_back(false);
        }
        vHashes.push_back(hash);
    }

    txn = CPartialMerkleTree(vHashes, vMatch);
}